

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_dp.c
# Opt level: O0

int gdReallocDynamic(dynamicPtr *dp,int required)

{
  void *pvVar1;
  void *newPtr;
  int required_local;
  dynamicPtr *dp_local;
  
  pvVar1 = gdRealloc(dp->data,(long)required);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = gdMalloc((long)required);
    if (pvVar1 == (void *)0x0) {
      dp->dataGood = 0;
      dp_local._4_4_ = 0;
    }
    else {
      memcpy(pvVar1,dp->data,(long)dp->logicalSize);
      gdFree(dp->data);
      dp->data = pvVar1;
      dp->realSize = required;
      dp_local._4_4_ = 1;
    }
  }
  else {
    dp->realSize = required;
    dp->data = pvVar1;
    dp_local._4_4_ = 1;
  }
  return dp_local._4_4_;
}

Assistant:

static int gdReallocDynamic(dynamicPtr *dp, int required)
{
	void *newPtr;

	/* First try gdRealloc().  If that doesn't work, make a new
	 * memory block and copy. */
	if((newPtr = gdRealloc(dp->data, required))) {
		dp->realSize = required;
		dp->data = newPtr;
		return TRUE;
	}

	/* create a new pointer */
	newPtr = gdMalloc(required);
	if(!newPtr) {
		dp->dataGood = FALSE;
		return FALSE;
	}

	/* copy the old data into it */
	memcpy(newPtr, dp->data, dp->logicalSize);
	gdFree(dp->data);
	dp->data = newPtr;

	dp->realSize = required;
	return TRUE;
}